

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count128_lcg_shift.hpp
# Opt level: O3

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,parameter_type *P)

{
  undefined4 uVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  istream *piVar3;
  long lVar4;
  parameter_type P_new;
  delim_c local_4c;
  delim_c local_4b;
  delim_c local_4a;
  delim_c local_49;
  uint128 local_48;
  result_type local_38;
  result_type rStack_30;
  
  local_38 = 0;
  rStack_30 = 0;
  local_48.value._0_8_ = 0;
  local_48.value._8_8_ = 0;
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_49.c = '(';
  pbVar2 = utility::operator>>(in,&local_49);
  pbVar2 = impl::operator>>(pbVar2,&local_48);
  local_4a.c = ' ';
  pbVar2 = utility::operator>>(pbVar2,&local_4a);
  piVar3 = std::istream::_M_extract<unsigned_long>((ulong *)pbVar2);
  local_4b.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_4b);
  piVar3 = std::istream::_M_extract<unsigned_long>((ulong *)pbVar2);
  local_4c.c = ')';
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_4c);
  lVar4 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar4 + 0x20] & 5) == 0) {
    P->a = local_38;
    P->b = rStack_30;
    *(undefined8 *)&(P->increment).value = (undefined8)local_48.value;
    *(undefined8 *)((long)&(P->increment).value + 8) = local_48.value._8_8_;
    lVar4 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar4 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, parameter_type &P) {
        parameter_type P_new;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> P_new.increment >> utility::delim(' ') >> P_new.a >>
            utility::delim(' ') >> P_new.b >> utility::delim(')');
        if (in)
          P = P_new;
        in.flags(flags);
        return in;
      }